

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O2

void copy_tensor(TENSOR *src,int copy_channels,int dst_offset,TENSOR *dst)

{
  int r;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((src->stride == dst->width) && (dst->stride == src->stride)) {
    uVar2 = 0;
    uVar3 = (ulong)(uint)copy_channels;
    if (copy_channels < 1) {
      uVar3 = uVar2;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      memcpy(dst->buf[(long)dst_offset + uVar2],src->buf[uVar2],
             (long)src->height * (long)src->width * 4);
    }
  }
  else {
    uVar2 = 0;
    uVar3 = (ulong)(uint)copy_channels;
    if (copy_channels < 1) {
      uVar3 = uVar2;
    }
    for (; uVar2 != uVar3; uVar2 = uVar2 + 1) {
      for (iVar1 = 0; iVar1 < dst->height; iVar1 = iVar1 + 1) {
        memcpy(dst->buf[(long)dst_offset + uVar2] + (long)dst->stride * (long)iVar1,
               src->buf[uVar2] + (long)src->stride * (long)iVar1,(long)dst->width << 2);
      }
    }
  }
  return;
}

Assistant:

static void copy_tensor(const TENSOR *src, int copy_channels, int dst_offset,
                        TENSOR *dst) {
  assert(src->width == dst->width);
  assert(src->height == dst->height);
  assert(copy_channels <= src->channels);
  if (src->stride == dst->width && dst->stride == dst->width) {
    for (int c = 0; c < copy_channels; ++c) {
      memcpy(dst->buf[dst_offset + c], src->buf[c],
             sizeof(*dst->buf[0]) * src->width * src->height);
    }
  } else {
    for (int c = 0; c < copy_channels; ++c) {
      for (int r = 0; r < dst->height; ++r) {
        memcpy(&dst->buf[dst_offset + c][r * dst->stride],
               &src->buf[c][r * src->stride],
               dst->width * sizeof(*dst->buf[c]));
      }
    }
  }
}